

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice.h
# Opt level: O0

void __thiscall Voice::~Voice(Voice *this)

{
  __pointer_type pVVar1;
  atomic<VoicePropsItem_*> *in_RDI;
  vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *unaff_retaddr;
  
  pVVar1 = std::atomic<VoicePropsItem_*>::exchange(in_RDI,(__pointer_type)0x0,memory_order_acq_rel);
  if (pVVar1 != (__pointer_type)0x0) {
    VoicePropsItem::operator_delete((void *)0x19f635);
  }
  std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

~Voice() { delete mUpdate.exchange(nullptr, std::memory_order_acq_rel); }